

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSU_TEST.cpp
# Opt level: O0

void __thiscall
Valid_test_case_DSU_DSU_unit_test_Test::TestBody(Valid_test_case_DSU_DSU_unit_test_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *message;
  char *in_R9;
  string local_80;
  AssertHelper local_60;
  Message local_58;
  bool local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  undefined1 local_28 [8];
  DSU dsu;
  Valid_test_case_DSU_DSU_unit_test_Test *this_local;
  
  dsu.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  DSU::DSU((DSU *)local_28);
  DSU::unionSet((DSU *)local_28,1,2);
  DSU::unionSet((DSU *)local_28,3,4);
  DSU::unionSet((DSU *)local_28,5,6);
  DSU::unionSet((DSU *)local_28,1,4);
  iVar2 = DSU::find((DSU *)local_28,4);
  iVar3 = DSU::find((DSU *)local_28,1);
  local_49 = iVar2 == iVar3;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,&local_49,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_48,(AssertionResult *)"dsu.find(4) == dsu.find(1)",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Data structures/Disjoint-set-union/DSU_TEST.cpp"
               ,0x10,message);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  DSU::~DSU((DSU *)local_28);
  return;
}

Assistant:

TEST(Valid_test_case_DSU, DSU_unit_test){
    DSU dsu;
    dsu.unionSet(1, 2);
    dsu.unionSet(3, 4);
    dsu.unionSet(5, 6);
    dsu.unionSet(1, 4);

    ASSERT_TRUE(dsu.find(4) == dsu.find(1));
}